

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permutation.h
# Opt level: O0

ArrayIDIDFunc * inverse_permutation<ArrayIDIDFunc>(ArrayIDIDFunc *f)

{
  int iVar1;
  int id;
  int *piVar2;
  ArrayIDIDFunc *in_RSI;
  ArrayIDIDFunc *in_RDI;
  int i;
  int id_count;
  ArrayIDIDFunc *inv_f;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int iVar3;
  ArrayIDIDFunc *this;
  undefined4 local_1c;
  
  this = in_RDI;
  iVar1 = ArrayIDFunc<int>::preimage_count(&in_RSI->super_ArrayIDFunc<int>);
  ArrayIDIDFunc::ArrayIDIDFunc(this,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
    iVar3 = local_1c;
    id = ArrayIDIDFunc::operator()(in_RSI,local_1c);
    piVar2 = ArrayIDFunc<int>::operator[](&in_RDI->super_ArrayIDFunc<int>,id);
    *piVar2 = iVar3;
  }
  return this;
}

Assistant:

ArrayIDIDFunc inverse_permutation(const IDIDFunc& f)
{
    assert(is_permutation(f));

    int id_count = f.preimage_count();

    ArrayIDIDFunc inv_f(id_count, id_count);
    for (int i = 0; i < id_count; ++i)
        inv_f[f(i)] = i;
    return inv_f; // NVRO
}